

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool google::protobuf::anon_unknown_23::IsNonMessageType(string_view type)

{
  int iVar1;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *this;
  long lVar2;
  undefined **ppuVar3;
  char **ppcVar4;
  byte bVar5;
  iterator iVar6;
  allocator_type local_a3;
  key_equal local_a2;
  hasher local_a1;
  key_arg<std::basic_string_view<char>_> local_a0;
  char *local_90 [16];
  
  bVar5 = 0;
  if ((anonymous_namespace)::IsNonMessageType(std::basic_string_view<char,std::char_traits<char>>)::
      non_message_types == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 IsNonMessageType(std::basic_string_view<char,std::char_traits<char>>)
                                 ::non_message_types);
    if (iVar1 != 0) {
      this = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              *)operator_new(0x20);
      ppuVar3 = &PTR_anon_var_dwarf_16cd22_004cfd70;
      ppcVar4 = local_90;
      for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
        *ppcVar4 = *ppuVar3;
        ppuVar3 = ppuVar3 + (ulong)bVar5 * -2 + 1;
        ppcVar4 = ppcVar4 + (ulong)bVar5 * -2 + 1;
      }
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::raw_hash_set<char_const*const*>
                (this,local_90,(char **)&stack0xfffffffffffffff0,0,&local_a1,&local_a2,&local_a3);
      IsNonMessageType::non_message_types =
           (flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)this;
      __cxa_guard_release(&(anonymous_namespace)::
                           IsNonMessageType(std::basic_string_view<char,std::char_traits<char>>)::
                           non_message_types);
    }
  }
  iVar6 = absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::find<std::basic_string_view<char,std::char_traits<char>>>
                    ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)IsNonMessageType::non_message_types,&local_a0);
  return iVar6.ctrl_ != (ctrl_t *)0x0;
}

Assistant:

bool IsNonMessageType(absl::string_view type) {
  static const auto* non_message_types =
      new absl::flat_hash_set<absl::string_view>(
          {"double", "float", "int64", "uint64", "int32", "fixed32", "fixed64",
           "bool", "string", "bytes", "uint32", "enum", "sfixed32", "sfixed64",
           "sint32", "sint64"});
  return non_message_types->contains(type);
}